

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O0

void * CSocekt::ServerTimerQueueMonitorThread(void *threadData)

{
  value_type p_Var1;
  SourceFile file;
  SourceFile file_00;
  bool bVar2;
  reference pp_Var3;
  long in_RDI;
  LPSTRUC_MSG_HEADER tmpmsg;
  LPSTRUC_MSG_HEADER result;
  list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> m_lsIdleList;
  int err;
  time_t cur_time;
  time_t absolute_time;
  CSocekt *pSocketObj;
  ThreadItem *pThread;
  list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *in_stack_ffffffffffffdf98;
  MutexLock *in_stack_ffffffffffffdfa0;
  LogStream *in_stack_ffffffffffffdfa8;
  SourceFile *in_stack_ffffffffffffdfb0;
  Logger *in_stack_ffffffffffffdfd0;
  Timestamp in_stack_ffffffffffffdfe0;
  CSocekt *in_stack_ffffffffffffdfe8;
  Logger local_1038;
  SourceFile *local_50;
  list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> local_48;
  int local_2c;
  time_t local_28;
  long local_20;
  long *local_18;
  
  local_18 = *(long **)(in_RDI + 8);
  while (g_stopEvent == 0) {
    if (local_18[0x34d] != 0) {
      local_20 = local_18[0x34e];
      local_28 = time((time_t *)0x0);
      if (local_20 < local_28) {
        std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::list
                  ((list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *)0x1437b4);
        muduo::MutexLock::lock(in_stack_ffffffffffffdfa0);
        if (local_2c != 0) {
          muduo::Logger::SourceFile::SourceFile<105>
                    (in_stack_ffffffffffffdfb0,(char (*) [105])in_stack_ffffffffffffdfa8);
          file._8_8_ = in_stack_ffffffffffffdfb0;
          file.data_ = (char *)in_stack_ffffffffffffdfa8;
          muduo::Logger::Logger
                    ((Logger *)in_stack_ffffffffffffdfa0,file,
                     (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20),
                     (LogLevel)in_stack_ffffffffffffdf98);
          muduo::Logger::stream(&local_1038);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfa8);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffdfa0,
                     (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20));
          muduo::Logger::~Logger(in_stack_ffffffffffffdfd0);
        }
        while (in_stack_ffffffffffffdfb0 =
                    (SourceFile *)
                    GetOverTimeTimer(in_stack_ffffffffffffdfe8,
                                     in_stack_ffffffffffffdfe0.microSecondsSinceEpoch_),
              local_50 = in_stack_ffffffffffffdfb0, in_stack_ffffffffffffdfb0 != (SourceFile *)0x0)
        {
          std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::push_back
                    ((list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *)
                     in_stack_ffffffffffffdfb0,(value_type *)in_stack_ffffffffffffdfa8);
        }
        muduo::MutexLock::unlock(in_stack_ffffffffffffdfa0);
        if (local_2c != 0) {
          muduo::Logger::SourceFile::SourceFile<105>
                    (in_stack_ffffffffffffdfb0,(char (*) [105])in_stack_ffffffffffffdfa8);
          file_00._8_8_ = in_stack_ffffffffffffdfb0;
          file_00.data_ = (char *)in_stack_ffffffffffffdfa8;
          muduo::Logger::Logger
                    ((Logger *)in_stack_ffffffffffffdfa0,file_00,
                     (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20),
                     (LogLevel)in_stack_ffffffffffffdf98);
          in_stack_ffffffffffffdfa8 = muduo::Logger::stream((Logger *)&stack0xffffffffffffdfe0);
          in_stack_ffffffffffffdfa0 =
               (MutexLock *)
               muduo::LogStream::operator<<
                         ((LogStream *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfa8);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffdfa0,
                     (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20));
          muduo::Logger::~Logger(in_stack_ffffffffffffdfd0);
        }
        while (bVar2 = std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>
                       ::empty(&local_48), ((bVar2 ^ 0xffU) & 1) != 0) {
          in_stack_ffffffffffffdf98 = &local_48;
          pp_Var3 = std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::
                    front((list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *)
                          in_stack_ffffffffffffdfa0);
          p_Var1 = *pp_Var3;
          std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::pop_front
                    ((list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *)
                     in_stack_ffffffffffffdfa0);
          (**(code **)(*local_18 + 0x38))(local_18,p_Var1,local_28);
        }
        std::__cxx11::list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::~list
                  ((list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> *)0x143a15);
      }
    }
    usleep(500000);
  }
  return (void *)0x0;
}

Assistant:

void* CSocekt::ServerTimerQueueMonitorThread(void* threadData)
{
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;

    time_t absolute_time,cur_time;
    int err;

    while(g_stopEvent == 0) //不退出
    {
        //这里没互斥判断，所以只是个初级判断，目的至少是队列为空时避免系统损耗		
		if(pSocketObj->m_cur_size_ > 0)//队列不为空，有内容
        {
			//时间队列中最近发生事情的时间放到 absolute_time里；
            absolute_time = pSocketObj->m_timer_value_; //这个可是省了个互斥，十分划算
            cur_time = time(NULL);
            if(absolute_time < cur_time)
            {
                //时间到了，可以处理了
                std::list<LPSTRUC_MSG_HEADER> m_lsIdleList; //将到期的连接放入到这个队列中
                LPSTRUC_MSG_HEADER result;

                pSocketObj->m_timequeueMutex.lock();  
                if(err != 0) LOG_ERROR << "CSocekt::ServerTimerQueueMonitorThread()中pthread_mutex_lock()失败，返回的错误码为" << err;//有问题，要及时报告
                while ((result = pSocketObj->GetOverTimeTimer(cur_time)) != NULL) //一次性的把所有超时节点都拿过来
				{
					m_lsIdleList.push_back(result); 
				}//end while
                pSocketObj->m_timequeueMutex.unlock();  
                if(err != 0) LOG_ERROR << "CSocekt::ServerTimerQueueMonitorThread()中pthread_mutex_lock()失败，返回的错误码为" << err;//有问题，要及时报告
                LPSTRUC_MSG_HEADER tmpmsg;
                while(!m_lsIdleList.empty())
                {
                    tmpmsg = m_lsIdleList.front();
					m_lsIdleList.pop_front(); 
                    pSocketObj->procPingTimeOutChecking(tmpmsg,cur_time); //这里需要检查心跳超时问题
                } //end while(!m_lsIdleList.empty())
            }
        } //end if(pSocketObj->m_cur_size_ > 0)
        
        usleep(500 * 1000); //为简化问题，我们直接每次休息500毫秒
    } //end while

    return (void*)0;
}